

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O1

size_t FSE_decompress_wksp_body_bmi2
                 (void *dst,size_t dstCapacity,void *cSrc,size_t cSrcSize,uint maxLog,
                 void *workSpace,size_t wkspSize)

{
  FSE_DTable *dt;
  byte bVar1;
  byte bVar2;
  sbyte sVar3;
  size_t sVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  int iVar8;
  ulong uVar9;
  long lVar10;
  ulong uVar11;
  undefined1 *puVar12;
  ulong uVar13;
  ulong uVar14;
  undefined1 *puVar15;
  bool bVar16;
  FSE_DState_t state1;
  uint maxSymbolValue;
  uint tableLog;
  BIT_DStream_t local_98;
  FSE_DState_t local_70;
  FSE_DState_t local_60;
  void *local_50;
  uint local_48;
  uint local_44;
  long local_40;
  size_t local_38;
  
  local_48 = 0xff;
  if (wkspSize < 0x204) {
    return 0xffffffffffffffff;
  }
  local_50 = dst;
  local_38 = dstCapacity;
  sVar4 = FSE_readNCount_body_bmi2((short *)workSpace,&local_48,&local_44,cSrc,cSrcSize);
  if (sVar4 < 0xffffffffffffff89) {
    if (local_44 <= maxLog) {
      cSrc = (void *)((long)cSrc + sVar4);
      cSrcSize = cSrcSize - sVar4;
      bVar16 = true;
      goto LAB_00157207;
    }
    sVar4 = 0xffffffffffffffd4;
  }
  bVar16 = false;
LAB_00157207:
  if (!bVar16) {
    return sVar4;
  }
  lVar10 = (long)(1 << (local_44 & 0x1f));
  if (wkspSize <
      ((1L << ((ulong)local_44 & 0x3f)) + (ulong)(local_48 + 1) * 2 + lVar10 * 4 + 0x13 &
      0xfffffffffffffffc) + 0x204) {
    return 0xffffffffffffffd4;
  }
  dt = (FSE_DTable *)((long)workSpace + 0x200);
  sVar4 = FSE_buildDTable_internal
                    (dt,(short *)workSpace,local_48,local_44,
                     (void *)(lVar10 * 4 + 0x208 + (long)workSpace),
                     (wkspSize - (lVar10 * 4 + 4)) - 0x204);
  if (0xffffffffffffff88 < sVar4) {
    return sVar4;
  }
  local_40 = (long)local_50 + local_38;
  puVar15 = (undefined1 *)((long)local_50 + (local_38 - 3));
  if (*(short *)((long)workSpace + 0x202) == 0) {
    sVar4 = BIT_initDStream(&local_98,cSrc,cSrcSize);
    if (0xffffffffffffff88 < sVar4) {
      return sVar4;
    }
    FSE_initDState(&local_60,&local_98,dt);
    FSE_initDState(&local_70,&local_98,dt);
    puVar12 = (undefined1 *)((long)local_50 + 1);
    do {
      iVar8 = (int)local_98.start;
      if (local_98.bitsConsumed < 0x41) {
        if (local_98.ptr < local_98.limitPtr) {
          if (local_98.ptr == local_98.start) goto LAB_0015739d;
          bVar16 = local_98.start <=
                   (ulong *)((long)local_98.ptr - (ulong)(local_98.bitsConsumed >> 3));
          uVar5 = (int)local_98.ptr - iVar8;
          if (bVar16) {
            uVar5 = local_98.bitsConsumed >> 3;
          }
          local_98.bitsConsumed = local_98.bitsConsumed + uVar5 * -8;
        }
        else {
          uVar5 = local_98.bitsConsumed >> 3;
          local_98.bitsConsumed = local_98.bitsConsumed & 7;
          bVar16 = true;
        }
        local_98.ptr = (char *)((long)local_98.ptr - (ulong)uVar5);
        local_98.bitContainer = *(size_t *)local_98.ptr;
      }
      else {
LAB_0015739d:
        bVar16 = false;
      }
      if ((puVar15 <= puVar12 + -1) || (!bVar16)) goto LAB_00157580;
      uVar14 = (ulong)*(ushort *)((long)local_60.table + local_60.state * 4);
      bVar1 = *(byte *)((long)local_60.table + local_60.state * 4 + 3);
      sVar3 = (bVar1 < 0x41) * ('@' - bVar1);
      uVar9 = ((local_98.bitContainer >>
               ((ulong)(byte)-(char)(local_98.bitsConsumed + bVar1) & 0x3f)) << sVar3) >> sVar3;
      puVar12[-1] = *(undefined1 *)((long)local_60.table + local_60.state * 4 + 2);
      uVar13 = (ulong)*(ushort *)((long)local_70.table + local_70.state * 4);
      bVar2 = *(byte *)((long)local_70.table + local_70.state * 4 + 3);
      iVar8 = local_98.bitsConsumed + bVar1 + (uint)bVar2;
      sVar3 = (bVar2 < 0x41) * ('@' - bVar2);
      uVar11 = ((local_98.bitContainer >> ((ulong)(byte)-(char)iVar8 & 0x3f)) << sVar3) >> sVar3;
      *puVar12 = *(undefined1 *)((long)local_70.table + local_70.state * 4 + 2);
      bVar1 = *(byte *)((long)local_60.table + uVar14 * 4 + uVar9 * 4 + 3);
      iVar8 = iVar8 + (uint)bVar1;
      sVar3 = (bVar1 < 0x41) * ('@' - bVar1);
      local_60.state =
           (((local_98.bitContainer >> ((ulong)(byte)-(char)iVar8 & 0x3f)) << sVar3) >> sVar3) +
           (ulong)*(ushort *)((long)local_60.table + uVar14 * 4 + uVar9 * 4);
      puVar12[1] = *(undefined1 *)((long)local_60.table + uVar14 * 4 + uVar9 * 4 + 2);
      bVar1 = *(byte *)((long)local_70.table + uVar13 * 4 + uVar11 * 4 + 3);
      local_98.bitsConsumed = iVar8 + (uint)bVar1;
      sVar3 = (bVar1 < 0x41) * ('@' - bVar1);
      local_70.state =
           (((local_98.bitContainer >> ((ulong)(byte)-(char)local_98.bitsConsumed & 0x3f)) << sVar3)
           >> sVar3) + (ulong)*(ushort *)((long)local_70.table + uVar13 * 4 + uVar11 * 4);
      puVar12[2] = *(undefined1 *)((long)local_70.table + uVar13 * 4 + uVar11 * 4 + 2);
      puVar12 = puVar12 + 4;
    } while( true );
  }
  if (cSrcSize == 0) {
    local_98.ptr = (char *)0x0;
    local_98.start = (char *)0x0;
    local_98.bitContainer = 0;
    local_98.bitsConsumed = 0;
    local_98._12_4_ = 0;
    local_98.limitPtr = (char *)0x0;
    cSrcSize = 0xffffffffffffffb8;
  }
  else {
    local_98.limitPtr = (char *)((long)cSrc + 8);
    local_98.start = (char *)cSrc;
    if (cSrcSize < 8) {
      local_98.bitContainer = (size_t)(byte)*cSrc;
      switch(cSrcSize) {
      case 7:
        local_98.bitContainer = (ulong)*(byte *)((long)cSrc + 6) << 0x30 | local_98.bitContainer;
      case 6:
        local_98.bitContainer = local_98.bitContainer + ((ulong)*(byte *)((long)cSrc + 5) << 0x28);
      case 5:
        local_98.bitContainer = local_98.bitContainer + ((ulong)*(byte *)((long)cSrc + 4) << 0x20);
      case 4:
        local_98.bitContainer = local_98.bitContainer + (ulong)*(byte *)((long)cSrc + 3) * 0x1000000
        ;
      case 3:
        local_98.bitContainer = local_98.bitContainer + (ulong)*(byte *)((long)cSrc + 2) * 0x10000;
      case 2:
        local_98.bitContainer = local_98.bitContainer + (ulong)*(byte *)((long)cSrc + 1) * 0x100;
      default:
        bVar1 = *(byte *)((long)cSrc + (cSrcSize - 1));
        uVar5 = (uint)bVar1;
        local_98.bitsConsumed = (LZCOUNT(uVar5) ^ 0xffffffe0U) + 9;
        if (uVar5 == 0) {
          local_98.bitsConsumed = (uint)bVar1;
        }
        local_98.ptr = (char *)cSrc;
        if (uVar5 == 0) {
          cSrcSize = 0xffffffffffffffec;
        }
        else {
          local_98.bitsConsumed = local_98.bitsConsumed + (int)cSrcSize * -8 + 0x40;
        }
      }
    }
    else {
      local_98.ptr = (char *)((long)cSrc + (cSrcSize - 8));
      local_98.bitContainer = *(size_t *)local_98.ptr;
      bVar1 = *(byte *)((long)cSrc + (cSrcSize - 1));
      uVar5 = (uint)bVar1;
      local_98.bitsConsumed = (LZCOUNT(uVar5) ^ 0xffffffe0U) + 9;
      if (uVar5 == 0) {
        local_98.bitsConsumed = (uint)bVar1;
      }
      if (uVar5 == 0) {
        cSrcSize = 0xffffffffffffffff;
      }
    }
  }
  if (0xffffffffffffff88 < cSrcSize) {
    return cSrcSize;
  }
  FSE_initDState(&local_60,&local_98,dt);
  FSE_initDState(&local_70,&local_98,dt);
  puVar12 = (undefined1 *)((long)local_50 + 1);
  do {
    iVar8 = (int)local_98.start;
    if (local_98.bitsConsumed < 0x41) {
      if (local_98.ptr < local_98.limitPtr) {
        if (local_98.ptr == local_98.start) goto LAB_0015774e;
        bVar16 = local_98.start <=
                 (ulong *)((long)local_98.ptr - (ulong)(local_98.bitsConsumed >> 3));
        uVar5 = (int)local_98.ptr - iVar8;
        if (bVar16) {
          uVar5 = local_98.bitsConsumed >> 3;
        }
        local_98.bitsConsumed = local_98.bitsConsumed + uVar5 * -8;
      }
      else {
        uVar5 = local_98.bitsConsumed >> 3;
        local_98.bitsConsumed = local_98.bitsConsumed & 7;
        bVar16 = true;
      }
      local_98.ptr = (char *)((long)local_98.ptr - (ulong)uVar5);
      local_98.bitContainer = *(size_t *)local_98.ptr;
    }
    else {
LAB_0015774e:
      bVar16 = false;
    }
    uVar9 = (ulong)local_98.bitsConsumed;
    if ((puVar15 <= puVar12 + -1) || (!bVar16)) goto LAB_0015784e;
    uVar14 = (ulong)*(ushort *)((long)local_60.table + local_60.state * 4);
    bVar1 = *(byte *)((long)local_60.table + local_60.state * 4 + 3);
    local_98.bitsConsumed = local_98.bitsConsumed + bVar1;
    uVar9 = (local_98.bitContainer << (uVar9 & 0x3f)) >> ((ulong)(byte)-bVar1 & 0x3f);
    puVar12[-1] = *(undefined1 *)((long)local_60.table + local_60.state * 4 + 2);
    uVar13 = (ulong)*(ushort *)((long)local_70.table + local_70.state * 4);
    bVar1 = *(byte *)((long)local_70.table + local_70.state * 4 + 3);
    uVar5 = local_98.bitsConsumed + bVar1;
    uVar11 = (local_98.bitContainer << ((ulong)local_98.bitsConsumed & 0x3f)) >>
             ((ulong)(byte)-bVar1 & 0x3f);
    *puVar12 = *(undefined1 *)((long)local_70.table + local_70.state * 4 + 2);
    bVar1 = *(byte *)((long)local_60.table + uVar14 * 4 + uVar9 * 4 + 3);
    uVar6 = uVar5 + bVar1;
    local_60.state =
         ((local_98.bitContainer << ((ulong)uVar5 & 0x3f)) >> ((ulong)(byte)-bVar1 & 0x3f)) +
         (ulong)*(ushort *)((long)local_60.table + uVar14 * 4 + uVar9 * 4);
    puVar12[1] = *(undefined1 *)((long)local_60.table + uVar14 * 4 + uVar9 * 4 + 2);
    bVar1 = *(byte *)((long)local_70.table + uVar13 * 4 + uVar11 * 4 + 3);
    local_98.bitsConsumed = uVar6 + bVar1;
    local_70.state =
         ((local_98.bitContainer << ((ulong)uVar6 & 0x3f)) >> ((ulong)(byte)-bVar1 & 0x3f)) +
         (ulong)*(ushort *)((long)local_70.table + uVar13 * 4 + uVar11 * 4);
    puVar12[2] = *(undefined1 *)((long)local_70.table + uVar13 * 4 + uVar11 * 4 + 2);
    puVar12 = puVar12 + 4;
  } while( true );
LAB_00157580:
  do {
    puVar15 = puVar12;
    if ((undefined1 *)(local_40 + -2) < puVar15 + -1) {
      return 0xffffffffffffffba;
    }
    lVar10 = local_60.state * 4;
    bVar1 = *(byte *)((long)local_60.table + local_60.state * 4 + 3);
    local_98.bitsConsumed = local_98.bitsConsumed + bVar1;
    sVar3 = (bVar1 < 0x41) * ('@' - bVar1);
    local_60.state =
         (((local_98.bitContainer >> ((ulong)(byte)-(char)local_98.bitsConsumed & 0x3f)) << sVar3)
         >> sVar3) + (ulong)*(ushort *)((long)local_60.table + local_60.state * 4);
    puVar15[-1] = *(undefined1 *)((long)local_60.table + lVar10 + 2);
    if (0x40 < local_98.bitsConsumed) {
LAB_00157a8a:
      *puVar15 = *(undefined1 *)((long)local_70.table + local_70.state * 4 + 2);
      puVar15 = puVar15 + 1;
      goto LAB_00157b4d;
    }
    if (local_98.ptr < local_98.limitPtr) {
      uVar5 = local_98.bitsConsumed;
      if (local_98.ptr != local_98.start) {
        uVar6 = (int)local_98.ptr - iVar8;
        if (local_98.start <= (ulong *)((long)local_98.ptr - (ulong)(local_98.bitsConsumed >> 3))) {
          uVar6 = local_98.bitsConsumed >> 3;
        }
        uVar5 = local_98.bitsConsumed + uVar6 * -8;
        goto LAB_00157637;
      }
    }
    else {
      uVar6 = local_98.bitsConsumed >> 3;
      uVar5 = local_98.bitsConsumed & 7;
LAB_00157637:
      local_98.ptr = (char *)((long)local_98.ptr - (ulong)uVar6);
      local_98.bitContainer = *(size_t *)local_98.ptr;
    }
    if (0x40 < local_98.bitsConsumed) goto LAB_00157a8a;
    if ((undefined1 *)(local_40 + -2) < puVar15) {
      return 0xffffffffffffffba;
    }
    lVar10 = local_70.state * 4;
    bVar1 = *(byte *)((long)local_70.table + local_70.state * 4 + 3);
    uVar5 = uVar5 + bVar1;
    sVar3 = (bVar1 < 0x41) * ('@' - bVar1);
    local_70.state =
         (((local_98.bitContainer >> ((ulong)(byte)-(char)uVar5 & 0x3f)) << sVar3) >> sVar3) +
         (ulong)*(ushort *)((long)local_70.table + local_70.state * 4);
    *puVar15 = *(undefined1 *)((long)local_70.table + lVar10 + 2);
    if (0x40 < uVar5) break;
    if (local_98.ptr < local_98.limitPtr) {
      local_98.bitsConsumed = uVar5;
      if (local_98.ptr != local_98.start) {
        uVar6 = (int)local_98.ptr - iVar8;
        if (local_98.start <= (ulong *)((long)local_98.ptr - (ulong)(uVar5 >> 3))) {
          uVar6 = uVar5 >> 3;
        }
        local_98.bitsConsumed = uVar5 + uVar6 * -8;
        goto LAB_001576c0;
      }
    }
    else {
      uVar6 = uVar5 >> 3;
      local_98.bitsConsumed = uVar5 & 7;
LAB_001576c0:
      local_98.ptr = (char *)((long)local_98.ptr - (ulong)uVar6);
      local_98.bitContainer = *(size_t *)local_98.ptr;
    }
    puVar12 = puVar15 + 2;
  } while (uVar5 < 0x41);
  puVar15[1] = *(undefined1 *)((long)local_60.table + local_60.state * 4 + 2);
  puVar15 = puVar15 + 2;
LAB_00157b4d:
  return (long)puVar15 - (long)local_50;
LAB_0015784e:
  do {
    puVar15 = puVar12;
    if ((undefined1 *)(local_40 + -2) < puVar15 + -1) {
      return 0xffffffffffffffba;
    }
    lVar10 = local_60.state * 4;
    bVar1 = *(byte *)((long)local_60.table + local_60.state * 4 + 3);
    uVar5 = (int)uVar9 + (uint)bVar1;
    local_60.state =
         ((local_98.bitContainer << (uVar9 & 0x3f)) >> ((ulong)(byte)-bVar1 & 0x3f)) +
         (ulong)*(ushort *)((long)local_60.table + local_60.state * 4);
    puVar15[-1] = *(undefined1 *)((long)local_60.table + lVar10 + 2);
    if (0x40 < uVar5) {
LAB_001579b9:
      *puVar15 = *(undefined1 *)((long)local_70.table + local_70.state * 4 + 2);
      puVar15 = puVar15 + 1;
      goto LAB_00157a7b;
    }
    if (local_98.ptr < local_98.limitPtr) {
      uVar6 = uVar5;
      if (local_98.ptr != local_98.start) {
        uVar7 = (int)local_98.ptr - iVar8;
        if (local_98.start <= (ulong *)((long)local_98.ptr - (ulong)(uVar5 >> 3))) {
          uVar7 = uVar5 >> 3;
        }
        uVar6 = uVar5 + uVar7 * -8;
        goto LAB_00157901;
      }
    }
    else {
      uVar7 = uVar5 >> 3;
      uVar6 = uVar5 & 7;
LAB_00157901:
      local_98.ptr = (char *)((long)local_98.ptr - (ulong)uVar7);
      local_98.bitContainer = *(size_t *)local_98.ptr;
    }
    if (0x40 < uVar5) goto LAB_001579b9;
    if ((undefined1 *)(local_40 + -2) < puVar15) {
      return 0xffffffffffffffba;
    }
    lVar10 = local_70.state * 4;
    bVar1 = *(byte *)((long)local_70.table + local_70.state * 4 + 3);
    uVar5 = uVar6 + bVar1;
    local_70.state =
         ((local_98.bitContainer << ((ulong)uVar6 & 0x3f)) >> ((ulong)(byte)-bVar1 & 0x3f)) +
         (ulong)*(ushort *)((long)local_70.table + local_70.state * 4);
    *puVar15 = *(undefined1 *)((long)local_70.table + lVar10 + 2);
    if (0x40 < uVar5) break;
    if (local_98.ptr < local_98.limitPtr) {
      uVar7 = uVar5;
      if (local_98.ptr != local_98.start) {
        uVar6 = (int)local_98.ptr - iVar8;
        if (local_98.start <= (ulong *)((long)local_98.ptr - (ulong)(uVar5 >> 3))) {
          uVar6 = uVar5 >> 3;
        }
        uVar7 = uVar5 + uVar6 * -8;
        goto LAB_00157990;
      }
    }
    else {
      uVar6 = uVar5 >> 3;
      uVar7 = uVar5 & 7;
LAB_00157990:
      local_98.ptr = (char *)((long)local_98.ptr - (ulong)uVar6);
      local_98.bitContainer = *(size_t *)local_98.ptr;
    }
    uVar9 = (ulong)uVar7;
    puVar12 = puVar15 + 2;
  } while (uVar5 < 0x41);
  puVar15[1] = *(undefined1 *)((long)local_60.table + local_60.state * 4 + 2);
  puVar15 = puVar15 + 2;
LAB_00157a7b:
  return (long)puVar15 - (long)local_50;
}

Assistant:

BMI2_TARGET_ATTRIBUTE static size_t FSE_decompress_wksp_body_bmi2(void* dst, size_t dstCapacity, const void* cSrc, size_t cSrcSize, unsigned maxLog, void* workSpace, size_t wkspSize)
{
    return FSE_decompress_wksp_body(dst, dstCapacity, cSrc, cSrcSize, maxLog, workSpace, wkspSize, 1);
}